

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  ostream *this_00;
  Type TVar1;
  TestPartResultArray *this_01;
  pointer pcVar2;
  int iVar3;
  TestPartResult *pTVar4;
  AssertionResult *pAVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  int index;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var8;
  undefined1 local_78 [8];
  string expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  undefined1 local_40 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  this_01 = this->results_;
  TVar1 = this->type_;
  pcVar7 = "1 non-fatal failure";
  if (TVar1 == kFatalFailure) {
    pcVar7 = "1 fatal failure";
  }
  local_78 = (undefined1  [8])&expected._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,pcVar7,pcVar7 + (ulong)(TVar1 != kFatalFailure) * 4 + 0xf);
  Message::Message((Message *)&local_48);
  _Var8._M_head_impl = local_48._M_head_impl;
  if ((int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 4) * -0x49249249 == 1) {
    pTVar4 = TestPartResultArray::GetTestPartResult(this_01,0);
    if (pTVar4->type_ == TVar1) {
      pcVar7 = strstr((pTVar4->message_)._M_dataplus._M_p,(this->substr_)._M_dataplus._M_p);
      if (pcVar7 != (char *)0x0) {
        expected.field_2._M_local_buf[8] = '\x01';
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        goto LAB_0010c586;
      }
      local_40[0] = false;
      local_38._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar5 = AssertionResult::operator<<((AssertionResult *)local_40,(char (*) [11])0x137b5e);
      pAVar5 = AssertionResult::operator<<
                         (pAVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [14])" containing \"");
      pAVar5 = AssertionResult::operator<<(pAVar5,&this->substr_);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [3])0x1386f6);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [11])"  Actual:\n");
      pAVar5 = AssertionResult::operator<<(pAVar5,pTVar4);
      AssertionResult::AssertionResult((AssertionResult *)((long)&expected.field_2 + 8),pAVar5);
    }
    else {
      local_40[0] = false;
      local_38._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar5 = AssertionResult::operator<<((AssertionResult *)local_40,(char (*) [11])0x137b5e);
      pAVar5 = AssertionResult::operator<<
                         (pAVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [2])0x1382f4);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [11])"  Actual:\n");
      pAVar5 = AssertionResult::operator<<(pAVar5,pTVar4);
      AssertionResult::AssertionResult((AssertionResult *)((long)&expected.field_2 + 8),pAVar5);
    }
  }
  else {
    this_00 = (ostream *)(local_48._M_head_impl + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"Expected: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (this_00,(char *)local_78,(long)expected._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"  Actual: ",10);
    std::ostream::operator<<
              ((ostream *)this_00,
               (int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 4) * -0x49249249);
    std::__ostream_insert<char,std::char_traits<char>>(this_00," failures",9);
    if (0 < (int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 4) * -0x49249249) {
      index = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(_Var8._M_head_impl + 0x10),"\n",1);
        pTVar4 = TestPartResultArray::GetTestPartResult(this_01,index);
        _Var8._M_head_impl = local_48._M_head_impl;
        testing::operator<<((ostream *)(local_48._M_head_impl + 0x10),pTVar4);
        index = index + 1;
        iVar3 = (int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 4);
      } while (SBORROW4(index,iVar3 * -0x49249249) != index + iVar3 * 0x49249249 < 0);
    }
    local_40[0] = false;
    local_38._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
    pAVar5 = AssertionResult::operator<<((AssertionResult *)local_40,(Message *)&local_48);
    AssertionResult::AssertionResult((AssertionResult *)((long)&expected.field_2 + 8),pAVar5);
  }
  if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )local_38._M_head_impl !=
      (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38._M_head_impl);
  }
LAB_0010c586:
  if (local_48._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  if (local_78 != (undefined1  [8])&expected._M_string_length) {
    operator_delete((void *)local_78,expected._M_string_length + 1);
  }
  __ptr_00 = local_50;
  if (expected.field_2._M_local_buf[8] != '\x01') {
    Message::Message((Message *)local_78);
    __ptr_00 = local_50;
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_50->_M_dataplus)._M_p;
    }
    AssertHelper::AssertHelper
              ((AssertHelper *)local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O3/source/tests/src/google-test-depends/googletest/src/gtest.cc"
               ,0x38b,pcVar7);
    AssertHelper::operator=((AssertHelper *)local_40,(Message *)local_78);
    AssertHelper::~AssertHelper((AssertHelper *)local_40);
    if (local_78 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_78 + 8))();
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,__ptr_00);
  }
  pcVar2 = (this->substr_)._M_dataplus._M_p;
  paVar6 = &(this->substr_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar6) {
    operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}